

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int nn_ipc_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  if (optvallen < 4) {
    return -0x16;
  }
  if (option == 3) {
    *(undefined4 *)((long)&self[2].vfptr + 4) = *optval;
  }
  else if (option == 2) {
    *(undefined4 *)&self[2].vfptr = *optval;
  }
  else {
    if (option != 1) {
      return -0x5c;
    }
    self[1].vfptr = (nn_optset_vfptr *)optval;
  }
  return 0;
}

Assistant:

static int nn_ipc_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);
    if (optvallen < sizeof (int)) {
        return -EINVAL;
    }

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        optset->sec_attr = (void *)optval;
        return 0;
    case NN_IPC_OUTBUFSZ:
        optset->outbuffersz = *(int *)optval;
        return 0;
    case NN_IPC_INBUFSZ:
        optset->inbuffersz = *(int *)optval;
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}